

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

double cert::sqrt(double __x)

{
  double dVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar6 = SUB84(__x,0);
  dVar1 = 1.05892563396802e-314;
  if ((0.0 <= fVar6) && (dVar1 = 1.05892563396802e-314, fVar6 != INFINITY)) {
    fVar7 = 0.0;
    fVar9 = fVar6;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      return __x;
    }
    do {
      fVar2 = fVar9;
      fVar9 = SUB84(__x,0);
      fVar8 = fVar9 - fVar7;
      uVar3 = -(uint)(-fVar8 <= fVar8);
      uVar4 = -(uint)(-fVar9 <= fVar9);
      uVar5 = -(uint)(-fVar7 <= fVar7);
      fVar9 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)-fVar7) +
              (float)(uVar4 & (uint)fVar9 | ~uVar4 & (uint)-fVar9);
      if (3.4028235e+38 <= fVar9) {
        fVar9 = 3.4028235e+38;
      }
      fVar7 = 1.1754944e-38;
      if (1.1754944e-38 <= fVar9 * 1.5258789e-05) {
        fVar7 = fVar9 * 1.5258789e-05;
      }
      if ((float)(~uVar3 & (uint)-fVar8 | (uint)fVar8 & uVar3) < fVar7) {
        return __x;
      }
      fVar9 = (fVar6 / fVar2 + fVar2) * 0.5;
      dVar1 = (double)(ulong)(uint)fVar9;
      fVar7 = fVar2;
      __x = (double)(ulong)(uint)fVar9;
    } while ((fVar9 != fVar2) || (__x = dVar1, NAN(fVar9) || NAN(fVar2)));
  }
  return dVar1;
}

Assistant:

constexpr float sqrt (float x)
{
	if (0 <= x && x < std::numeric_limits<double>::infinity ())
	{
		double curr = x;
		double prev = 0;
		while (!nearly_equal (curr, prev))
		{
			prev = curr;
			curr = 0.5 * (curr + x / curr);
		}
		return curr;
	}
	else
	{
		return std::numeric_limits<double>::quiet_NaN ();
	}
}